

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  byte *pbVar1;
  uint uVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  byte bVar7;
  char cVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  byte bVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ImGuiTableColumn *pIVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ImRect host_clip_rect;
  ImRect local_58;
  ImGuiTableInstanceData *local_48;
  ImRect local_40;
  
  pIVar6 = GImGui;
  uVar17 = table->Flags;
  uVar12 = (ulong)(uint)table->ColumnsCount;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  fVar25 = (pIVar6->Style).FramePadding.x;
  fVar26 = 1.0;
  if (1.0 <= fVar25) {
    fVar26 = fVar25;
  }
  table->MinColumnWidth = fVar26;
  iVar11 = 0;
  if (table->ColumnsCount < 1) {
    uVar19 = 0xff;
    fVar25 = 0.0;
    fVar26 = 0.0;
    bVar10 = false;
    fVar23 = 0.0;
    cVar9 = '\0';
    uVar20 = uVar17;
  }
  else {
    uVar19 = 0xffffffff;
    uVar18 = 0;
    cVar9 = '\0';
    bVar10 = false;
    iVar16 = 0;
    fVar26 = 0.0;
    fVar25 = 0.0;
    do {
      bVar14 = (table->DisplayOrderToIndex).Data[uVar18];
      uVar20 = (uint)(char)bVar14;
      if (uVar18 != uVar20) {
        table->IsDefaultDisplayOrder = false;
      }
      pIVar21 = (table->Columns).Data + (char)bVar14;
      if (table->DeclColumnsCount <= (char)bVar14) {
        TableSetupColumnFlags(table,pIVar21,0);
        pIVar21->NameOffset = -1;
        pIVar21->UserID = 0;
        pIVar21->InitStretchWeightOrWidth = -1.0;
      }
      if (((table->Flags & 4) == 0) || ((pIVar21->Flags & 0x80) != 0)) {
        pIVar21->IsUserEnabledNextFrame = true;
        bVar7 = true;
      }
      else {
        bVar7 = pIVar21->IsUserEnabledNextFrame;
      }
      if (pIVar21->IsUserEnabled != (bool)bVar7) {
        pIVar21->IsUserEnabled = (bool)bVar7;
        table->IsSettingsDirty = true;
        bVar7 = pIVar21->IsUserEnabled;
      }
      bVar13 = (bool)((pIVar21->Flags & 1U) == 0 & bVar7);
      pIVar21->IsEnabled = bVar13;
      cVar8 = pIVar21->SortOrder;
      if ((cVar8 != -1) && (bVar13 == false)) {
        table->IsSortSpecsDirty = true;
        cVar8 = pIVar21->SortOrder;
      }
      if (('\0' < cVar8) && ((table->Flags & 0x4000000) == 0)) {
        table->IsSortSpecsDirty = true;
      }
      if ((&pIVar21->WidthRequest)[(ulong)((pIVar21->Flags & 0x10) == 0) * 2] <= 0.0 &&
          (&pIVar21->WidthRequest)[(ulong)((pIVar21->Flags & 0x10) == 0) * 2] != 0.0) {
        pIVar21->AutoFitQueue = '\a';
        pIVar21->CannotSkipItemsQueue = '\a';
      }
      if (pIVar21->IsEnabled == false) {
        pIVar21->IndexWithinEnabledSet = -1;
      }
      else {
        pIVar21->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar19;
        pIVar21->NextEnabledColumn = -1;
        if (uVar19 == 0xffffffff) {
          table->LeftMostEnabledColumn = bVar14;
        }
        else {
          (table->Columns).Data[(int)uVar19].NextEnabledColumn = bVar14;
        }
        cVar8 = table->ColumnsEnabledCount;
        table->ColumnsEnabledCount = cVar8 + '\x01';
        pIVar21->IndexWithinEnabledSet = cVar8;
        table->EnabledMaskByIndex = table->EnabledMaskByIndex | 1L << (bVar14 & 0x3f);
        table->EnabledMaskByDisplayOrder =
             table->EnabledMaskByDisplayOrder | 1L << (pIVar21->DisplayOrder & 0x3fU);
        if (pIVar21->IsPreserveWidthAuto == false) {
          fVar23 = TableGetColumnWidthAuto(table,pIVar21);
          pIVar21->WidthAuto = fVar23;
        }
        uVar2 = pIVar21->Flags;
        if ((uVar2 & 0x20) == 0) {
          iVar16 = 1;
        }
        if ((((uVar2 & 0x10) != 0) && ((uVar2 & 0x20) != 0)) &&
           (0.0 < pIVar21->InitStretchWeightOrWidth)) {
          pIVar21->WidthAuto = pIVar21->InitStretchWeightOrWidth;
        }
        bVar10 = (bool)(bVar10 | pIVar21->AutoFitQueue != '\0');
        fVar23 = pIVar21->WidthAuto;
        uVar19 = uVar20;
        if ((uVar2 & 8) == 0) {
          fVar25 = (float)((uint)fVar25 & -(uint)(fVar23 <= fVar25) |
                          ~-(uint)(fVar23 <= fVar25) & (uint)fVar23);
          cVar9 = cVar9 + '\x01';
        }
        else {
          fVar26 = fVar26 + fVar23;
          iVar11 = iVar11 + 1;
        }
      }
      uVar18 = uVar18 + 1;
      uVar12 = (ulong)table->ColumnsCount;
    } while ((long)uVar18 < (long)uVar12);
    fVar23 = (float)iVar11;
    uVar20 = table->Flags;
    iVar11 = iVar16;
  }
  if ((((uVar20 & 8) != 0) && ((uVar20 >> 0x1b & 1) == 0)) && (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar19;
  if (bVar10) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
      uVar12 = (ulong)(uint)table->ColumnsCount;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  if ((int)uVar12 < 1) {
    fVar24 = 0.0;
    fVar27 = 0.0;
  }
  else {
    uVar17 = uVar17 & 0xe000;
    lVar15 = 99;
    uVar18 = 0;
    fVar27 = 0.0;
    fVar24 = 0.0;
    do {
      bVar14 = (byte)uVar18;
      if ((table->EnabledMaskByIndex >> (uVar18 & 0x3f) & 1) != 0) {
        pIVar21 = (table->Columns).Data;
        uVar20 = *(uint *)((long)pIVar21 + lVar15 + -99);
        if ((uVar20 & 0x10) == 0) {
          if ((((uVar20 & 0x20) != 0) || (*(char *)((long)&pIVar21->Flags + lVar15) != '\0')) ||
             (fVar28 = *(float *)((long)pIVar21 + lVar15 + -0x4b), fVar28 < 0.0)) {
            fVar28 = *(float *)((long)pIVar21 + lVar15 + -0x47);
            bVar10 = fVar28 <= 0.0;
            if (fVar28 <= 0.0) {
              fVar28 = 1.0;
            }
            if (bVar10 && uVar17 == 0x6000) {
              fVar28 = (*(float *)((long)pIVar21 + lVar15 + -0x4f) / fVar26) * fVar23;
            }
            *(float *)((long)pIVar21 + lVar15 + -0x4b) = fVar28;
          }
          if (((long)table->LeftMostStretchedColumn == -1) ||
             (*(char *)((long)pIVar21 + lVar15 + -0x11) <
              (table->Columns).Data[table->LeftMostStretchedColumn].DisplayOrder)) {
            table->LeftMostStretchedColumn = bVar14;
          }
          fVar24 = fVar24 + fVar28;
          if (((long)table->RightMostStretchedColumn == -1) ||
             ((table->Columns).Data[table->RightMostStretchedColumn].DisplayOrder <
              *(char *)((long)pIVar21 + lVar15 + -0x11))) {
            table->RightMostStretchedColumn = bVar14;
          }
        }
        else {
          cVar8 = *(char *)((long)&pIVar21->Flags + lVar15);
          if (uVar17 == 0x4000) {
            fVar28 = fVar25;
            if ((uVar20 & 0x20) != 0 || cVar8 != '\0') goto LAB_0022ed3b;
          }
          else {
            fVar28 = *(float *)((long)pIVar21 + lVar15 + -0x4f);
LAB_0022ed3b:
            if (cVar8 == '\0') {
              if (((uVar20 & 0x20) != 0) &&
                 ((table->RequestOutputMaskByIndex & 1L << (bVar14 & 0x3f)) != 0)) {
                *(float *)((long)pIVar21 + lVar15 + -0x53) = fVar28;
              }
            }
            else {
              *(float *)((long)pIVar21 + lVar15 + -0x53) = fVar28;
              if (((cVar8 != '\x01') && (table->IsInitializing == true)) &&
                 (*(char *)((long)pIVar21 + lVar15 + -2) == '\0')) {
                fVar28 = *(float *)((long)pIVar21 + lVar15 + -0x53);
                fVar29 = table->MinColumnWidth * 4.0;
                uVar20 = -(uint)(fVar29 <= fVar28);
                *(uint *)((long)pIVar21 + lVar15 + -0x53) =
                     ~uVar20 & (uint)fVar29 | (uint)fVar28 & uVar20;
              }
            }
          }
          fVar27 = fVar27 + *(float *)((long)pIVar21 + lVar15 + -0x53);
        }
        *(undefined1 *)((long)pIVar21 + lVar15 + -2) = 0;
        fVar27 = fVar27 + table->CellPaddingX + table->CellPaddingX;
        uVar12 = (ulong)(uint)table->ColumnsCount;
      }
      uVar18 = uVar18 + 1;
      lVar15 = lVar15 + 0x68;
    } while ((long)uVar18 < (long)(int)uVar12);
  }
  uVar17 = (uint)uVar12;
  table->ColumnsEnabledFixedCount = cVar9;
  table->ColumnsStretchSumWeights = fVar24;
  fVar25 = (table->WorkRect).Min.x;
  fVar26 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsEnabledCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((table->Flags & 0x1000000) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth)))
  {
    fVar23 = (table->WorkRect).Max.x - fVar25;
  }
  else {
    fVar23 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar28 = (table->WorkRect).Min.y;
  fVar27 = (fVar23 - fVar26) - fVar27;
  table->ColumnsGivenWidth =
       (float)(int)table->ColumnsEnabledCount * (table->CellPaddingX + table->CellPaddingX) + fVar26
  ;
  fVar26 = fVar27;
  if (0 < (int)uVar17) {
    lVar15 = 0;
    uVar18 = 0;
    do {
      if ((table->EnabledMaskByIndex >> (uVar18 & 0x3f) & 1) != 0) {
        pIVar21 = (table->Columns).Data;
        uVar17 = *(uint *)((long)&pIVar21->Flags + lVar15);
        if ((uVar17 & 8) != 0) {
          fVar23 = (*(float *)((long)&pIVar21->StretchWeight + lVar15) / fVar24) * fVar27;
          uVar20 = -(uint)(table->MinColumnWidth <= fVar23);
          fVar23 = (float)(int)((float)(~uVar20 & (uint)table->MinColumnWidth |
                                       (uint)fVar23 & uVar20) + 0.01);
          *(float *)((long)&pIVar21->WidthRequest + lVar15) = fVar23;
          fVar26 = fVar26 - fVar23;
        }
        if (((&pIVar21->NextEnabledColumn)[lVar15] == -1) && (table->LeftMostStretchedColumn != -1))
        {
          *(uint *)((long)&pIVar21->Flags + lVar15) = uVar17 | 0x40000000;
        }
        fVar23 = *(float *)((long)&pIVar21->WidthRequest + lVar15);
        uVar17 = -(uint)(table->MinColumnWidth <= fVar23);
        fVar23 = (float)(int)(float)(~uVar17 & (uint)table->MinColumnWidth | (uint)fVar23 & uVar17);
        *(float *)((long)&pIVar21->WidthGiven + lVar15) = fVar23;
        table->ColumnsGivenWidth = fVar23 + table->ColumnsGivenWidth;
        uVar12 = (ulong)(uint)table->ColumnsCount;
      }
      uVar18 = uVar18 + 1;
      uVar17 = (uint)uVar12;
      lVar15 = lVar15 + 0x68;
    } while ((long)uVar18 < (long)(int)uVar17);
  }
  if (((1.0 <= fVar26) && ((table->Flags & 0x80000) == 0)) && ((0 < (int)uVar17 && (0.0 < fVar24))))
  {
    uVar12 = (ulong)uVar17;
    do {
      if ((table->EnabledMaskByDisplayOrder >> ((ulong)((int)uVar12 - 1U & 0xff) & 0x3f) & 1) != 0)
      {
        pIVar21 = (table->Columns).Data;
        cVar9 = (table->DisplayOrderToIndex).Data[uVar12 - 1];
        if ((pIVar21[cVar9].Flags & 8) != 0) {
          pIVar21[cVar9].WidthRequest = pIVar21[cVar9].WidthRequest + 1.0;
          pIVar21[cVar9].WidthGiven = pIVar21[cVar9].WidthGiven + 1.0;
          fVar26 = fVar26 + -1.0;
        }
      }
    } while ((1.0 <= fVar26) && (bVar10 = 1 < uVar12, uVar12 = uVar12 - 1, bVar10));
  }
  if ((long)table->InstanceCurrent == 0) {
    local_48 = &table->InstanceDataFirst;
  }
  else {
    local_48 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar26 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar23 = local_40.Min.y + local_48->LastOuterHeight;
  uVar17 = -(uint)(fVar23 <= fVar26);
  local_40.Max.y = (float)(uVar17 & (uint)fVar26 | ~uVar17 & (uint)fVar23);
  IVar3 = pIVar6->ActiveId;
  pIVar6->ActiveId = 0;
  bVar13 = ItemHoverable(&local_40,0);
  pIVar6->ActiveId = IVar3;
  bVar10 = '\0' < table->FreezeColumnsCount;
  fVar26 = fVar25;
  if ('\0' < table->FreezeColumnsCount) {
    fVar26 = (table->OuterRect).Min.x;
  }
  local_58.Min = (table->InnerClipRect).Min;
  local_58.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar12 = (ulong)(uint)table->ColumnsCount;
  if (0 < table->ColumnsCount) {
    fVar26 = (fVar26 + table->OuterPaddingX) - table->CellSpacingX1;
    uVar18 = 0;
    iVar16 = 0;
    do {
      bVar14 = (table->DisplayOrderToIndex).Data[uVar18];
      bVar22 = true;
      if (table->FreezeRowsCount < '\x01') {
        bVar22 = (char)bVar14 < table->FreezeColumnsCount;
      }
      pIVar21 = (table->Columns).Data + (char)bVar14;
      pIVar21->NavLayerCurrent = bVar22;
      if (bVar10) {
        bVar10 = true;
        if (iVar16 == table->FreezeColumnsCount) {
          fVar26 = fVar26 + (fVar25 - (table->OuterRect).Min.x);
          goto LAB_0022f170;
        }
      }
      else {
LAB_0022f170:
        bVar10 = false;
      }
      pbVar1 = (byte *)((long)&pIVar21->Flags + 3);
      *pbVar1 = *pbVar1 & 0xf0;
      if ((table->EnabledMaskByDisplayOrder >> (uVar18 & 0x3f) & 1) == 0) {
        (pIVar21->ClipRect).Max.x = fVar26;
        (pIVar21->ClipRect).Min.x = fVar26;
        pIVar21->WorkMinX = fVar26;
        pIVar21->MaxX = fVar26;
        pIVar21->MinX = fVar26;
        pIVar21->WidthGiven = 0.0;
        (pIVar21->ClipRect).Min.y = fVar28;
        (pIVar21->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar21->ClipRect,&local_58);
        pIVar21->IsVisibleX = false;
        pIVar21->IsVisibleY = false;
        pIVar21->IsRequestOutput = false;
        pIVar21->IsSkipItems = true;
        pIVar21->ItemWidth = 1.0;
      }
      else {
        if (((bVar13) && (fVar23 = (pIVar6->IO).MousePos.x, (pIVar21->ClipRect).Min.x <= fVar23)) &&
           (fVar23 < (pIVar21->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar14;
        }
        pIVar21->MinX = fVar26;
        fVar24 = TableGetMaxColumnWidth(table,(int)(char)bVar14);
        fVar23 = pIVar21->WidthGiven;
        if (fVar24 <= pIVar21->WidthGiven) {
          fVar23 = fVar24;
        }
        pIVar21->WidthGiven = fVar23;
        fVar24 = pIVar21->WidthRequest;
        if (table->MinColumnWidth <= pIVar21->WidthRequest) {
          fVar24 = table->MinColumnWidth;
        }
        fVar23 = (float)(~-(uint)(fVar24 <= fVar23) & (uint)fVar24 |
                        (uint)fVar23 & -(uint)(fVar24 <= fVar23));
        pIVar21->WidthGiven = fVar23;
        fVar24 = table->CellPaddingX + table->CellPaddingX +
                 fVar23 + fVar26 + table->CellSpacingX1 + table->CellSpacingX2;
        pIVar21->MaxX = fVar24;
        pIVar21->WorkMinX = table->CellPaddingX + fVar26 + table->CellSpacingX1;
        pIVar21->WorkMaxX = (fVar24 - table->CellPaddingX) - table->CellSpacingX2;
        pIVar21->ItemWidth = (float)(int)(fVar23 * 0.65);
        (pIVar21->ClipRect).Min.x = fVar26;
        (pIVar21->ClipRect).Min.y = fVar28;
        (pIVar21->ClipRect).Max.x = fVar24;
        (pIVar21->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar21->ClipRect,&local_58);
        fVar23 = (pIVar21->ClipRect).Min.x;
        fVar24 = (pIVar21->ClipRect).Max.x;
        pIVar21->IsVisibleX = fVar23 < fVar24;
        pIVar21->IsVisibleY = true;
        if (fVar24 <= fVar23) {
          if (pIVar21->AutoFitQueue != '\0') goto LAB_0022f36c;
          bVar22 = pIVar21->CannotSkipItemsQueue != '\0';
          pIVar21->IsRequestOutput = bVar22;
          if (bVar22) goto LAB_0022f377;
        }
        else {
          table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar14 & 0x3f);
LAB_0022f36c:
          pIVar21->IsRequestOutput = true;
LAB_0022f377:
          table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar14 & 0x3f);
        }
        bVar22 = true;
        if (pIVar21->IsEnabled == true) {
          bVar22 = table->HostSkipItems;
        }
        pIVar21->IsSkipItems = bVar22;
        uVar17 = (uint)(fVar23 < fVar24) << 0x19 | pIVar21->Flags;
        uVar20 = uVar17 | 0x1000000;
        pIVar21->Flags = uVar20;
        if (pIVar21->SortOrder != -1) {
          uVar20 = uVar17 | 0x5000000;
          pIVar21->Flags = uVar20;
        }
        if (table->HoveredColumnBody == bVar14) {
          pIVar21->Flags = uVar20 | 0x8000000;
        }
        fVar23 = pIVar21->WorkMinX;
        pIVar21->ContentMaxXFrozen = fVar23;
        pIVar21->ContentMaxXUnfrozen = fVar23;
        pIVar21->ContentMaxXHeadersUsed = fVar23;
        pIVar21->ContentMaxXHeadersIdeal = fVar23;
        if (table->HostSkipItems == false) {
          pIVar21->AutoFitQueue = pIVar21->AutoFitQueue >> 1;
          pIVar21->CannotSkipItemsQueue = pIVar21->CannotSkipItemsQueue >> 1;
        }
        if (iVar16 < table->FreezeColumnsCount) {
          fVar24 = pIVar21->MaxX + 1.0;
          fVar23 = local_58.Max.x;
          if (fVar24 <= local_58.Max.x) {
            fVar23 = fVar24;
          }
          local_58.Min.x =
               (float)(-(uint)(fVar24 < local_58.Min.x) & (uint)local_58.Min.x |
                      ~-(uint)(fVar24 < local_58.Min.x) & (uint)fVar23);
        }
        fVar26 = fVar26 + table->CellPaddingX + table->CellPaddingX +
                          pIVar21->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
        iVar16 = iVar16 + 1;
      }
      uVar18 = uVar18 + 1;
      uVar12 = (ulong)table->ColumnsCount;
    } while ((long)uVar18 < (long)uVar12);
  }
  fVar25 = (table->WorkRect).Min.x;
  fVar26 = (table->Columns).Data[table->RightMostEnabledColumn].ClipRect.Max.x;
  uVar17 = -(uint)(fVar26 <= fVar25);
  fVar25 = (float)(uVar17 & (uint)fVar25 | ~uVar17 & (uint)fVar26);
  if (((bVar13) && (table->HoveredColumnBody == -1)) && (fVar25 <= (pIVar6->IO).MousePos.x)) {
    table->HoveredColumnBody = (ImGuiTableColumnIdx)uVar12;
  }
  uVar17 = table->Flags;
  if ((char)iVar11 == '\0' && (uVar17 & 1) != 0) {
    uVar17 = uVar17 & 0xfffffffe;
    table->Flags = uVar17;
  }
  if (table->RightMostStretchedColumn != -1) {
    uVar17 = uVar17 & 0xfffeffff;
    table->Flags = uVar17;
  }
  if ((uVar17 >> 0x10 & 1) != 0) {
    (table->WorkRect).Max.x = fVar25;
    (table->OuterRect).Max.x = fVar25;
    fVar26 = (table->InnerClipRect).Max.x;
    if (fVar25 <= fVar26) {
      fVar26 = fVar25;
    }
    (table->InnerClipRect).Max.x = fVar26;
  }
  pIVar4 = table->InnerWindow;
  IVar5 = (table->WorkRect).Max;
  (pIVar4->ParentWorkRect).Min = (table->WorkRect).Min;
  (pIVar4->ParentWorkRect).Max = IVar5;
  fVar25 = (table->InnerClipRect).Max.x;
  table->BorderX1 = (table->InnerClipRect).Min.x;
  table->BorderX2 = fVar25;
  TableSetupDrawChannels(table);
  if ((table->Flags & 1) != 0) {
    TableUpdateBorders(table);
  }
  local_48->LastFirstRowHeight = 0.0;
  table->IsLayoutLocked = true;
  table->IsUsingHeaders = false;
  bVar10 = TableBeginContextMenuPopup(table);
  if (bVar10) {
    TableDrawContextMenu(table);
    EndPopup();
  }
  uVar17 = table->Flags;
  if (((byte)((uVar17 & 8) >> 3) & table->IsSortSpecsDirty) == 1) {
    TableSortSpecsBuild(table);
    uVar17 = table->Flags;
  }
  pIVar4 = table->InnerWindow;
  if ((uVar17 >> 0x14 & 1) == 0) {
    ImDrawList::PushClipRect(pIVar4->DrawList,&(pIVar4->ClipRect).Min,&(pIVar4->ClipRect).Max,false)
    ;
  }
  else {
    ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar4->DrawList,2);
  }
  return;
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings and sort specs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsUserEnabledNextFrame = true;
        if (column->IsUserEnabled != column->IsUserEnabledNextFrame)
        {
            column->IsUserEnabled = column->IsUserEnabledNextFrame;
            table->IsSettingsDirty = true;
        }
        column->IsEnabled = column->IsUserEnabled && (column->Flags & ImGuiTableColumnFlags_Disabled) == 0;

        if (column->SortOrder != -1 && !column->IsEnabled)
            table->IsSortSpecsDirty = true;
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto;

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;
    table->ColumnsStretchSumWeights = stretch_sum_weights;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Determine if table is hovered which will be used to flag columns as hovered.
    // - In principle we'd like to use the equivalent of IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem),
    //   but because our item is partially submitted at this point we use ItemHoverable() and a workaround (temporarily
    //   clear ActiveId, which is equivalent to the change provided by _AllowWhenBLockedByActiveItem).
    // - This allows columns to be marked as hovered when e.g. clicking a button inside the column, or using drag and drop.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table_instance->LastOuterHeight));
    const ImGuiID backup_active_id = g.ActiveId;
    g.ActiveId = 0;
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);
    g.ActiveId = backup_active_id;

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table_instance->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (TableBeginContextMenuPopup(table))
    {
        TableDrawContextMenu(table);
        EndPopup();
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter->SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}